

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_d_generator.cc
# Opt level: O0

void __thiscall t_d_generator::init_generator(t_d_generator *this)

{
  t_program *this_00;
  bool bVar1;
  int iVar2;
  char *pcVar3;
  int *piVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  ulong uVar6;
  ostream *poVar7;
  vector<t_program_*,_std::allocator<t_program_*>_> *this_01;
  reference pptVar8;
  string *psVar9;
  int __oflag;
  string local_388;
  t_program *local_368;
  t_program *include;
  const_iterator __end1;
  const_iterator __begin1;
  vector<t_program_*,_std::allocator<t_program_*>_> *__range1;
  vector<t_program_*,_std::allocator<t_program_*>_> *includes;
  string local_320 [39];
  allocator local_2f9;
  string local_2f8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  undefined1 local_2b8 [8];
  string f_types_name;
  allocator local_271;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  int local_22c;
  undefined1 local_228 [4];
  int r_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  string local_1e8 [38];
  undefined1 local_1c2;
  allocator local_1c1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  int local_17c;
  undefined1 local_178 [4];
  int r_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  long local_118;
  size_type loc;
  string subdir;
  string local_e8;
  undefined1 local_c8 [8];
  string dir;
  undefined1 local_98 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38 [36];
  int local_14;
  t_d_generator *ptStack_10;
  int r;
  t_d_generator *this_local;
  
  ptStack_10 = this;
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1b])(local_38);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  iVar2 = mkdir(pcVar3,0x1ff);
  std::__cxx11::string::~string(local_38);
  local_14 = iVar2;
  if ((iVar2 == -1) && (piVar4 = __errno_location(), *piVar4 != 0x11)) {
    dir.field_2._M_local_buf[10] = '\x01';
    pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             __cxa_allocate_exception(0x20);
    (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1b])(local_98);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_78,pcVar3,(allocator *)(dir.field_2._M_local_buf + 0xb));
    std::operator+(&local_58,&local_78,": ");
    piVar4 = __errno_location();
    pcVar3 = strerror(*piVar4);
    std::operator+(pbVar5,&local_58,pcVar3);
    dir.field_2._M_local_buf[10] = '\0';
    __cxa_throw(pbVar5,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  this_00 = (this->super_t_oop_generator).super_t_generator.program_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_e8,"d",(allocator *)(subdir.field_2._M_local_buf + 0xf));
  t_program::get_namespace((string *)local_c8,this_00,&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator((allocator<char> *)(subdir.field_2._M_local_buf + 0xf));
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1b])(&loc);
  while( true ) {
    local_118 = std::__cxx11::string::find(local_c8,0x4e5538);
    if (local_118 == -1) {
      uVar6 = std::__cxx11::string::empty();
      if ((uVar6 & 1) == 0) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_228,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&loc,"/"
                      );
        std::operator+(&local_208,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_228,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8
                      );
        std::__cxx11::string::operator=((string *)&loc,(string *)&local_208);
        std::__cxx11::string::~string((string *)&local_208);
        std::__cxx11::string::~string((string *)local_228);
        pcVar3 = (char *)std::__cxx11::string::c_str();
        local_22c = mkdir(pcVar3,0x1ff);
        if ((local_22c == -1) && (piVar4 = __errno_location(), *piVar4 != 0x11)) {
          pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   __cxa_allocate_exception(0x20);
          pcVar3 = (char *)std::__cxx11::string::c_str();
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_270,pcVar3,&local_271);
          std::operator+(&local_250,&local_270,": ");
          piVar4 = __errno_location();
          pcVar3 = strerror(*piVar4);
          std::operator+(pbVar5,&local_250,pcVar3);
          __cxa_throw(pbVar5,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
        }
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&f_types_name.field_2 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&loc,"/");
      std::__cxx11::string::operator=
                ((string *)&this->package_dir_,(string *)(f_types_name.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(f_types_name.field_2._M_local_buf + 8));
      std::operator+(&local_2d8,&this->package_dir_,
                     &(this->super_t_oop_generator).super_t_generator.program_name_);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b8,
                     &local_2d8,"_types.d");
      std::__cxx11::string::~string((string *)&local_2d8);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2f8,pcVar3,&local_2f9);
      template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::open
                (&this->f_types_,(char *)local_2f8,__oflag);
      std::__cxx11::string::~string(local_2f8);
      std::allocator<char>::~allocator((allocator<char> *)&local_2f9);
      (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1c])(local_320);
      poVar7 = std::operator<<((ostream *)&this->f_types_,local_320);
      poVar7 = std::operator<<(poVar7,"module ");
      render_package_abi_cxx11_
                ((string *)&includes,this,(this->super_t_oop_generator).super_t_generator.program_);
      poVar7 = std::operator<<(poVar7,(string *)&includes);
      poVar7 = std::operator<<(poVar7,(string *)
                                      &(this->super_t_oop_generator).super_t_generator.program_name_
                              );
      poVar7 = std::operator<<(poVar7,"_types;");
      poVar7 = std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
      std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&includes);
      std::__cxx11::string::~string(local_320);
      print_default_imports(this,(ostream *)&this->f_types_);
      this_01 = t_program::get_includes((this->super_t_oop_generator).super_t_generator.program_);
      __end1 = std::vector<t_program_*,_std::allocator<t_program_*>_>::begin(this_01);
      include = (t_program *)std::vector<t_program_*,_std::allocator<t_program_*>_>::end(this_01);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end1,(__normal_iterator<t_program_*const_*,_std::vector<t_program_*,_std::allocator<t_program_*>_>_>
                                         *)&include), bVar1) {
        pptVar8 = __gnu_cxx::
                  __normal_iterator<t_program_*const_*,_std::vector<t_program_*,_std::allocator<t_program_*>_>_>
                  ::operator*(&__end1);
        local_368 = *pptVar8;
        poVar7 = std::operator<<((ostream *)&this->f_types_,"public import ");
        render_package_abi_cxx11_(&local_388,this,local_368);
        poVar7 = std::operator<<(poVar7,(string *)&local_388);
        psVar9 = t_program::get_name_abi_cxx11_(local_368);
        poVar7 = std::operator<<(poVar7,(string *)psVar9);
        poVar7 = std::operator<<(poVar7,"_types;");
        std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_388);
        __gnu_cxx::
        __normal_iterator<t_program_*const_*,_std::vector<t_program_*,_std::allocator<t_program_*>_>_>
        ::operator++(&__end1);
      }
      bVar1 = std::vector<t_program_*,_std::allocator<t_program_*>_>::empty(this_01);
      if (!bVar1) {
        std::operator<<((ostream *)&this->f_types_,(string *)&::endl_abi_cxx11_);
      }
      std::__cxx11::string::~string((string *)local_2b8);
      std::__cxx11::string::~string((string *)&loc);
      std::__cxx11::string::~string((string *)local_c8);
      return;
    }
    std::operator+(&local_158,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&loc,"/");
    std::__cxx11::string::substr((ulong)local_178,(ulong)local_c8);
    std::operator+(&local_138,&local_158,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_178);
    std::__cxx11::string::operator=((string *)&loc,(string *)&local_138);
    std::__cxx11::string::~string((string *)&local_138);
    std::__cxx11::string::~string((string *)local_178);
    std::__cxx11::string::~string((string *)&local_158);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    local_17c = mkdir(pcVar3,0x1ff);
    if ((local_17c == -1) && (piVar4 = __errno_location(), *piVar4 != 0x11)) break;
    std::__cxx11::string::substr((ulong)local_1e8,(ulong)local_c8);
    std::__cxx11::string::operator=((string *)local_c8,local_1e8);
    std::__cxx11::string::~string(local_1e8);
  }
  local_1c2 = 1;
  pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           __cxa_allocate_exception(0x20);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1c0,pcVar3,&local_1c1);
  std::operator+(&local_1a0,&local_1c0,": ");
  piVar4 = __errno_location();
  pcVar3 = strerror(*piVar4);
  std::operator+(pbVar5,&local_1a0,pcVar3);
  local_1c2 = 0;
  __cxa_throw(pbVar5,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
}

Assistant:

void init_generator() override {
    // Make output directory
    MKDIR(get_out_dir().c_str());

    string dir = program_->get_namespace("d");
    string subdir = get_out_dir();
    string::size_type loc;
    while ((loc = dir.find(".")) != string::npos) {
      subdir = subdir + "/" + dir.substr(0, loc);
      MKDIR(subdir.c_str());
      dir = dir.substr(loc + 1);
    }
    if (!dir.empty()) {
      subdir = subdir + "/" + dir;
      MKDIR(subdir.c_str());
    }

    package_dir_ = subdir + "/";

    // Make output file
    string f_types_name = package_dir_ + program_name_ + "_types.d";
    f_types_.open(f_types_name.c_str());

    // Print header
    f_types_ << autogen_comment() << "module " << render_package(*program_) << program_name_
             << "_types;" << endl << endl;

    print_default_imports(f_types_);

    // Include type modules from other imported programs.
    const vector<t_program*>& includes = program_->get_includes();
    for (auto include : includes) {
      f_types_ << "public import " << render_package(*include) << include->get_name()
               << "_types;" << endl;
    }
    if (!includes.empty())
      f_types_ << endl;
  }